

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void init_array_internal(double *a,int ndim,int *dims)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  int idx [7];
  
  uVar5 = (ulong)(uint)ndim;
  uVar2 = 1;
  if (0 < ndim) {
    uVar4 = 0;
    do {
      uVar2 = (ulong)(uint)((int)uVar2 * dims[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      if (0 < ndim) {
        uVar6 = 0;
        uVar3 = uVar4;
        do {
          iVar1 = (int)uVar3;
          uVar3 = (long)iVar1 / (long)dims[uVar6];
          idx[uVar6] = iVar1 % dims[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      dVar7 = 0.0;
      if (0 < ndim) {
        uVar3 = 0;
        dVar8 = 1.0;
        do {
          dVar7 = dVar7 + (double)idx[uVar3] * dVar8;
          dVar8 = dVar8 * 100.0;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      a[uVar4] = dVar7;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void init_array_internal(double *a, int ndim, int dims[])
{
    int idx[GA_MAX_DIM];
    int i,dim, elems;

        elems = 1;
        for(i=0;i<ndim;i++)elems *= dims[i];

     for(i=0; i<elems; i++){
        int Index = i;
        double field, val;
        
        for(dim = 0; dim < ndim; dim++){
            idx[dim] = Index%dims[dim];
            Index /= dims[dim];
        }
        
                field=1.; val=0.;
        for(dim=0; dim< ndim;dim++){
            val += field*idx[dim];
            field *= BASE;
        }
        a[i] = val;
        /* printf("(%d,%d,%d)=%6.0f",idx[0],idx[1],idx[2],val); */
    }
}